

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::analyzeFinal(Solver *this,Lit p,LSet *out_conflict)

{
  int iVar1;
  CRef CVar2;
  int iVar3;
  Lit k;
  char *pcVar4;
  int *piVar5;
  Lit *pLVar6;
  Clause *this_00;
  int local_4c;
  int j;
  Clause *c;
  int local_2c;
  Var x;
  int i;
  LSet *out_conflict_local;
  Solver *this_local;
  Lit p_local;
  
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,p);
  iVar1 = decisionLevel(this);
  if (iVar1 != 0) {
    iVar1 = var(p);
    pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar1);
    *pcVar4 = '\x01';
    local_2c = vec<Minisat::Lit,_int>::size(&this->trail);
    while( true ) {
      local_2c = local_2c + -1;
      piVar5 = vec<int,_int>::operator[](&this->trail_lim,0);
      if (local_2c < *piVar5) break;
      pLVar6 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_2c);
      iVar1 = var((Lit)pLVar6->x);
      pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar1
                         );
      if (*pcVar4 != '\0') {
        CVar2 = reason(this,iVar1);
        if (CVar2 == 0xffffffff) {
          iVar3 = level(this,iVar1);
          if (iVar3 < 1) {
            __assert_fail("level(x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                          ,0x1d6,"void Minisat::Solver::analyzeFinal(Lit, LSet &)");
          }
          pLVar6 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_2c);
          k = operator~(pLVar6->x);
          IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
                    (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,k);
        }
        else {
          CVar2 = reason(this,iVar1);
          this_00 = ClauseAllocator::operator[](&this->ca,CVar2);
          for (local_4c = 1; iVar3 = Clause::size(this_00), local_4c < iVar3;
              local_4c = local_4c + 1) {
            pLVar6 = Clause::operator[](this_00,local_4c);
            iVar3 = var((Lit)pLVar6->x);
            iVar3 = level(this,iVar3);
            if (0 < iVar3) {
              pLVar6 = Clause::operator[](this_00,local_4c);
              iVar3 = var((Lit)pLVar6->x);
              pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                 (&(this->seen).
                                   super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3);
              *pcVar4 = '\x01';
            }
          }
        }
        pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            iVar1);
        *pcVar4 = '\0';
      }
    }
    iVar1 = var(p);
    pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar1);
    *pcVar4 = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, LSet& out_conflict)
{
    out_conflict.clear();
    out_conflict.insert(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.insert(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                for (int j = 1; j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }
            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}